

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm_writer.cpp
# Opt level: O0

void snestistics::asm_writer
               (ReportWriter *report,Options *options,Trace *trace,AnnotationResolver *annotations,
               RomAccessor *rom_accessor)

{
  byte op;
  uint p_00;
  uint uVar1;
  Pointer PVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  uint16_t uVar5;
  undefined3 uVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool is_predicted_00;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  uint32_t uVar14;
  int iVar15;
  reference pAVar16;
  ulong uVar17;
  uchar *__ptr;
  string *thing;
  pointer ppVar18;
  byte *data_00;
  OpInfo *pOVar19;
  reference pvVar20;
  reference pvVar21;
  mapped_type *pmVar22;
  iterator __first;
  iterator __last;
  size_type sVar23;
  pointer ppVar24;
  undefined8 uVar25;
  char *pcVar26;
  size_type_conflict sVar27;
  reference pvVar28;
  char *pcVar29;
  ulong in_stack_ffffffffffff82e8;
  uint uVar30;
  undefined4 uVar31;
  long in_stack_ffffffffffff82f0;
  uint uVar32;
  undefined4 uVar33;
  long in_stack_ffffffffffff82f8;
  uint uVar34;
  undefined4 uVar35;
  char *local_7cd8;
  uint local_7cc4;
  ushort local_7c7a;
  ushort local_7c6a;
  byte local_7ba1;
  byte local_7b8a;
  ushort local_7b82;
  ushort local_7b72;
  bool local_7aed;
  string *local_7a78;
  allocator local_7a41;
  string local_7a40 [36];
  uint local_7a1c;
  undefined1 local_7a15;
  int num_bytes;
  bool reverse;
  StringBuilder ss_2;
  DmaTransfer *d;
  string local_6a00 [32];
  undefined1 local_69e0 [8];
  string name_2;
  string local_69c0 [8];
  string use_comment_1;
  undefined1 local_69a0 [8];
  StringBuilder ss_1;
  int value_1;
  OpInfo *v2;
  uint local_5988;
  uint32_t vi2;
  int skipped_1;
  int iStack_597c;
  bool first_2;
  Range r_2;
  StringBuilder ranges_1;
  OpInfo *v_1;
  uint32_t variant_idx_2;
  undefined1 local_4940 [8];
  string name_1;
  _Self local_4920;
  _Self local_4918;
  iterator pit;
  CombinationBool local_4908;
  CombinationBool local_4904;
  allocator local_48f1;
  string local_48f0 [36];
  CombinationBool local_48cc;
  CombinationBool local_48c8;
  CombinationBool local_48c4;
  Combination16 local_48c0;
  CombinationBool local_48bc;
  undefined2 local_48b8;
  undefined1 local_48b6;
  undefined2 local_48b4;
  undefined1 local_48b2;
  allocator local_48b1;
  string local_48b0 [39];
  allocator local_4889;
  string local_4888 [32];
  char local_4868 [8];
  char wow [256];
  CombinationBool local_4760;
  CombinationBool local_475c;
  allocator local_4749;
  string local_4748 [39];
  allocator local_4721;
  string local_4720 [32];
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4700;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_46f8;
  undefined1 local_46f0 [8];
  string name;
  undefined1 local_46cc [7];
  bool name_in_code;
  StringBuilder ss;
  anon_class_24_3_79b0c3fc variant_writer;
  string line_comment;
  undefined1 local_3688 [7];
  bool first_1;
  StringBuilder sb_1;
  bool has_remark;
  string use_comment;
  _Self local_2660;
  _Self local_2658;
  Pointer local_2650;
  ResultType local_264c;
  Pointer p_1;
  ResultType r;
  MagicWord ra;
  MagicByte rb;
  undefined1 local_263a [8];
  CPURegisters reg;
  bool skip;
  int value;
  OpInfo *vi;
  uint32_t v;
  Range r_1;
  bool first;
  int skipped;
  int max_size;
  StringBuilder ranges;
  OpInfo *vit_1;
  uint32_t variant_idx_1;
  StringBuilder sb;
  OpInfo *vit;
  uint local_5d0;
  uint32_t variant_idx;
  uint32_t source_idx;
  uint32_t num_unique_variants;
  key_type local_5b4;
  key_type local_5b0;
  Pointer branch_target_1;
  Pointer branch_target;
  uint16_t operand16;
  OpInfo *o;
  iterator __end3;
  iterator __begin3;
  vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_> *__range3;
  undefined1 uStack_580;
  bool local_57f;
  undefined1 auStack_57e [2];
  CombinationBool index_wide;
  CombinationBool accumulator_wide;
  Combination16 shared_dp;
  Combination8 shared_db;
  bool depend_DP;
  bool depend_DB;
  bool depend_Y;
  bool depend_X;
  bool is_indirect;
  bool is_jump;
  Proposals proposals;
  uint32_t numBytesNeeded;
  int numBitsNeeded;
  char target_label [128];
  char target_1 [128];
  bool is_predicted;
  bool emu;
  bool ind16;
  bool acc16;
  OpInfo *first_variant;
  uint8_t opcode;
  uint8_t *data;
  uint32_t uStack_410;
  OpVariantLookup variant_lookup;
  string local_3e0 [39];
  byte local_3b9;
  string local_3b8 [7];
  bool shortmode;
  string description;
  string local_398 [8];
  string line_use_comment;
  string local_378 [8];
  string line_comment_1;
  string local_358 [8];
  string label;
  uint local_334;
  Pointer p;
  bool emitted_label;
  iterator iStack_328;
  Pointer pc;
  _Self local_320;
  iterator opsit;
  vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_> variants;
  Pointer nextOp;
  char local_2d8 [8];
  char target [512];
  Annotation *a_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<snestistics::Annotation,_std::allocator<snestistics::Annotation>_> *__range1_1;
  undefined1 local_b0 [7];
  char newline;
  Array<unsigned_char> header;
  Annotation *a;
  const_iterator __end1;
  const_iterator __begin1;
  vector<snestistics::Annotation,_std::allocator<snestistics::Annotation>_> *__range1;
  undefined1 local_68 [4];
  int next_dma_event;
  AsmWriteWLADX writer;
  RomAccessor *rom_accessor_local;
  AnnotationResolver *annotations_local;
  Trace *trace_local;
  Options *options_local;
  ReportWriter *report_local;
  
  writer.m_report = (ReportWriter *)rom_accessor;
  anon_unknown.dwarf_a4d1::AsmWriteWLADX::AsmWriteWLADX
            ((AsmWriteWLADX *)local_68,report,options,rom_accessor);
  __range1._4_4_ = 0;
  __end1 = std::vector<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>::begin
                     (&annotations->_annotations);
  a = (Annotation *)
      std::vector<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>::end
                (&annotations->_annotations);
  while (bVar7 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_snestistics::Annotation_*,_std::vector<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>_>
                                     *)&a), bVar7) {
    pAVar16 = __gnu_cxx::
              __normal_iterator<const_snestistics::Annotation_*,_std::vector<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>_>
              ::operator*(&__end1);
    if ((pAVar16->type == ANNOTATION_FUNCTION) ||
       ((pAVar16->type == ANNOTATION_LINE &&
        (uVar17 = std::__cxx11::string::empty(), (uVar17 & 1) == 0)))) {
      LargeBitfield::set_bit(&trace->labels,pAVar16->startOfRange,true);
    }
    __gnu_cxx::
    __normal_iterator<const_snestistics::Annotation_*,_std::vector<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>_>
    ::operator++(&__end1);
  }
  anon_unknown.dwarf_a4d1::AsmWriteWLADX::writeSeperator((AsmWriteWLADX *)local_68,"Header");
  uVar17 = std::__cxx11::string::empty();
  if ((uVar17 & 1) == 0) {
    Array<unsigned_char>::Array((Array<unsigned_char> *)local_b0,0,false);
    read_file(&options->asm_header_file,(Array<unsigned_char> *)local_b0);
    __ptr = Array<unsigned_char>::operator[]((Array<unsigned_char> *)local_b0,0);
    uVar14 = Array<unsigned_char>::size((Array<unsigned_char> *)local_b0);
    fwrite(__ptr,(ulong)uVar14,1,(FILE *)report->report);
    __range1_1._7_1_ = 10;
    fwrite((void *)((long)&__range1_1 + 7),1,1,(FILE *)report->report);
    Array<unsigned_char>::~Array((Array<unsigned_char> *)local_b0);
  }
  anon_unknown.dwarf_a4d1::AsmWriteWLADX::write_vectors
            ((AsmWriteWLADX *)local_68,annotations,&trace->labels);
  anon_unknown.dwarf_a4d1::AsmWriteWLADX::writeSeperator((AsmWriteWLADX *)local_68,"Data");
  __end1_1 = std::vector<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>::begin
                       (&annotations->_annotations);
  a_1 = (Annotation *)
        std::vector<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>::end
                  (&annotations->_annotations);
  while (bVar7 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_snestistics::Annotation_*,_std::vector<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>_>
                             *)&a_1), bVar7) {
    target._504_8_ =
         __gnu_cxx::
         __normal_iterator<const_snestistics::Annotation_*,_std::vector<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>_>
         ::operator*(&__end1_1);
    if (((reference)target._504_8_)->type == ANNOTATION_DATA) {
      sprintf(local_2d8,"$%04X",(ulong)(ushort)((reference)target._504_8_)->startOfRange);
      thing = (string *)(target._504_8_ + 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&nextOp,local_2d8,
                 (allocator *)
                 ((long)&variants.
                         super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      uVar17 = std::__cxx11::string::empty();
      if ((uVar17 & 1) == 0) {
        local_7a78 = (string *)(target._504_8_ + 0x28);
      }
      else {
        local_7a78 = (string *)(target._504_8_ + 0x50);
      }
      anon_unknown.dwarf_a4d1::AsmWriteWLADX::writeDefine
                ((AsmWriteWLADX *)local_68,thing,(string *)&nextOp,local_7a78);
      std::__cxx11::string::~string((string *)&nextOp);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&variants.
                         super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    }
    __gnu_cxx::
    __normal_iterator<const_snestistics::Annotation_*,_std::vector<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>_>
    ::operator++(&__end1_1);
  }
  anon_unknown.dwarf_a4d1::AsmWriteWLADX::writeSeperator((AsmWriteWLADX *)local_68,"Code");
  variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0xffffffff;
  std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::vector
            ((vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_> *)&opsit);
  std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::reserve
            ((vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_> *)&opsit,0x10000);
  local_320._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_snestistics::Trace::OpVariantLookup,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>_>_>
       ::begin(&trace->ops);
  do {
    iStack_328 = std::
                 map<unsigned_int,_snestistics::Trace::OpVariantLookup,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>_>_>
                 ::end(&trace->ops);
    bVar7 = std::operator!=(&local_320,&stack0xfffffffffffffcd8);
    if (!bVar7) {
      std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::~vector
                ((vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_> *)&opsit);
      anon_unknown.dwarf_a4d1::AsmWriteWLADX::~AsmWriteWLADX((AsmWriteWLADX *)local_68);
      return;
    }
    ppVar18 = std::
              _Rb_tree_iterator<std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>_>
              ::operator->(&local_320);
    p_00 = ppVar18->first;
    if ((uint)variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage == 0xffffffff) {
      variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage._0_4_ = p_00;
    }
    bVar7 = false;
    for (local_334 = (uint)variants.
                           super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage; local_334 <= p_00;
        local_334 = local_334 + 1) {
      bVar8 = LargeBitfield::operator[](&trace->labels,local_334);
      if (bVar8) {
        std::__cxx11::string::string(local_358);
        std::__cxx11::string::string(local_378);
        std::__cxx11::string::string(local_398);
        AnnotationResolver::line_info
                  (annotations,local_334,(string *)local_358,(string *)local_378,(string *)local_398
                   ,true);
        std::__cxx11::string::string(local_3b8,local_378);
        uVar17 = std::__cxx11::string::empty();
        if ((uVar17 & 1) != 0) {
          std::__cxx11::string::operator=(local_3b8,local_398);
        }
        local_3b9 = 0;
        std::__cxx11::string::string(local_3e0,local_3b8);
        variant_lookup.offset._2_1_ = 0;
        if ((local_3b9 & 1) == 0) {
          std::allocator<char>::allocator();
          variant_lookup.offset._2_1_ = 1;
          std::__cxx11::string::string
                    ((string *)&variant_lookup.count,"",
                     (allocator *)((long)&variant_lookup.offset + 3));
        }
        else {
          std::__cxx11::string::string((string *)&variant_lookup.count,local_3b8);
        }
        anon_unknown.dwarf_a4d1::AsmWriteWLADX::writeLabel
                  ((AsmWriteWLADX *)local_68,local_334,(string *)local_358,(string *)local_3e0,
                   (string *)&variant_lookup.count);
        std::__cxx11::string::~string((string *)&variant_lookup.count);
        if ((variant_lookup.offset._2_1_ & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)((long)&variant_lookup.offset + 3));
        }
        std::__cxx11::string::~string(local_3e0);
        if (local_334 == p_00) {
          bVar7 = true;
        }
        std::__cxx11::string::~string(local_3b8);
        std::__cxx11::string::~string(local_398);
        std::__cxx11::string::~string(local_378);
        std::__cxx11::string::~string(local_358);
      }
    }
    ppVar18 = std::
              _Rb_tree_iterator<std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>_>
              ::operator->(&local_320);
    unique0x00012000 = ppVar18->second;
    if (uStack_410 == 0) {
      __assert_fail("variant_lookup.count != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/asm_writer.cpp"
                    ,0x26d,
                    "void snestistics::asm_writer(ReportWriter &, const Options &, Trace &, const AnnotationResolver &, const RomAccessor &)"
                   );
    }
    data_00 = RomAccessor::evalPtr((RomAccessor *)writer.m_report,p_00);
    op = *data_00;
    pOVar19 = Trace::variant(trace,(OpVariantLookup *)((long)&data + 4),0);
    bVar8 = is_memory_accumulator_wide(pOVar19->P);
    bVar9 = is_index_wide(pOVar19->P);
    bVar10 = is_emulation_mode(pOVar19->P);
    is_predicted_00 = LargeBitfield::operator[](&trace->is_predicted,p_00);
    if (bVar10) {
      printf("emu mode at pc %06X\n",(ulong)p_00);
    }
    target_label[0x78] = '\0';
    target_label[0x79] = '\0';
    target_label[0x7a] = '\0';
    target_label[0x7b] = '\0';
    target_label[0x7c] = '\0';
    target_label[0x7d] = '\0';
    target_label[0x7e] = '\0';
    target_label[0x7f] = '\0';
    target_label[0x68] = '\0';
    target_label[0x69] = '\0';
    target_label[0x6a] = '\0';
    target_label[0x6b] = '\0';
    target_label[0x6c] = '\0';
    target_label[0x6d] = '\0';
    target_label[0x6e] = '\0';
    target_label[0x6f] = '\0';
    target_label[0x70] = '\0';
    target_label[0x71] = '\0';
    target_label[0x72] = '\0';
    target_label[0x73] = '\0';
    target_label[0x74] = '\0';
    target_label[0x75] = '\0';
    target_label[0x76] = '\0';
    target_label[0x77] = '\0';
    target_label[0x58] = '\0';
    target_label[0x59] = '\0';
    target_label[0x5a] = '\0';
    target_label[0x5b] = '\0';
    target_label[0x5c] = '\0';
    target_label[0x5d] = '\0';
    target_label[0x5e] = '\0';
    target_label[0x5f] = '\0';
    target_label[0x60] = '\0';
    target_label[0x61] = '\0';
    target_label[0x62] = '\0';
    target_label[99] = '\0';
    target_label[100] = '\0';
    target_label[0x65] = '\0';
    target_label[0x66] = '\0';
    target_label[0x67] = '\0';
    target_label[0x48] = '\0';
    target_label[0x49] = '\0';
    target_label[0x4a] = '\0';
    target_label[0x4b] = '\0';
    target_label[0x4c] = '\0';
    target_label[0x4d] = '\0';
    target_label[0x4e] = '\0';
    target_label[0x4f] = '\0';
    target_label[0x50] = '\0';
    target_label[0x51] = '\0';
    target_label[0x52] = '\0';
    target_label[0x53] = '\0';
    target_label[0x54] = '\0';
    target_label[0x55] = '\0';
    target_label[0x56] = '\0';
    target_label[0x57] = '\0';
    target_label[0x38] = '\0';
    target_label[0x39] = '\0';
    target_label[0x3a] = '\0';
    target_label[0x3b] = '\0';
    target_label[0x3c] = '\0';
    target_label[0x3d] = '\0';
    target_label[0x3e] = '\0';
    target_label[0x3f] = '\0';
    target_label[0x40] = '\0';
    target_label[0x41] = '\0';
    target_label[0x42] = '\0';
    target_label[0x43] = '\0';
    target_label[0x44] = '\0';
    target_label[0x45] = '\0';
    target_label[0x46] = '\0';
    target_label[0x47] = '\0';
    target_label[0x28] = '\0';
    target_label[0x29] = '\0';
    target_label[0x2a] = '\0';
    target_label[0x2b] = '\0';
    target_label[0x2c] = '\0';
    target_label[0x2d] = '\0';
    target_label[0x2e] = '\0';
    target_label[0x2f] = '\0';
    target_label[0x30] = '\0';
    target_label[0x31] = '\0';
    target_label[0x32] = '\0';
    target_label[0x33] = '\0';
    target_label[0x34] = '\0';
    target_label[0x35] = '\0';
    target_label[0x36] = '\0';
    target_label[0x37] = '\0';
    target_label[0x18] = '\0';
    target_label[0x19] = '\0';
    target_label[0x1a] = '\0';
    target_label[0x1b] = '\0';
    target_label[0x1c] = '\0';
    target_label[0x1d] = '\0';
    target_label[0x1e] = '\0';
    target_label[0x1f] = '\0';
    target_label[0x20] = '\0';
    target_label[0x21] = '\0';
    target_label[0x22] = '\0';
    target_label[0x23] = '\0';
    target_label[0x24] = '\0';
    target_label[0x25] = '\0';
    target_label[0x26] = '\0';
    target_label[0x27] = '\0';
    target_label[8] = '\0';
    target_label[9] = '\0';
    target_label[10] = '\0';
    target_label[0xb] = '\0';
    target_label[0xc] = '\0';
    target_label[0xd] = '\0';
    target_label[0xe] = '\0';
    target_label[0xf] = '\0';
    target_label[0x10] = '\0';
    target_label[0x11] = '\0';
    target_label[0x12] = '\0';
    target_label[0x13] = '\0';
    target_label[0x14] = '\0';
    target_label[0x15] = '\0';
    target_label[0x16] = '\0';
    target_label[0x17] = '\0';
    _numBytesNeeded = 0;
    target_label[0] = '\0';
    target_label[1] = '\0';
    target_label[2] = '\0';
    target_label[3] = '\0';
    target_label[4] = '\0';
    target_label[5] = '\0';
    target_label[6] = '\0';
    target_label[7] = '\0';
    proposals._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 8;
    proposals._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
         calculateFormattingandSize
                   (data_00,bVar8,bVar9,target_label + 0x78,(char *)&numBytesNeeded,
                    (int *)((long)&proposals._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
    variants.super__Vector_base<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ =
         p_00 + (uint32_t)proposals._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::
    map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&shared_db.single_value);
    shared_db.value = jumps[op] & 1;
    bVar8 = cputable::is_indirect(op);
    bVar9 = cputable::address_depend_x(op);
    bVar10 = cputable::address_depend_y(op);
    bVar11 = cputable::address_depend_db(op);
    if ((shared_db.value & 1) == 0) {
      local_7aed = cputable::address_depend_dp(op);
    }
    else {
      local_7aed = false;
    }
    std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::resize
              ((vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_> *)&opsit,
               (ulong)stack0xfffffffffffffbec >> 0x20);
    pvVar20 = std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::operator[]
                        ((vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_> *)&opsit
                         ,0);
    pvVar21 = std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::operator[]
                        (&trace->ops_variants,(ulong)stack0xfffffffffffffbec & 0xffffffff);
    memcpy(pvVar20,pvVar21,((ulong)stack0xfffffffffffffbec >> 0x20) * 0x14);
    anon_unknown.dwarf_a4d1::CombinationT<unsigned_char>::CombinationT
              ((CombinationT<unsigned_char> *)&accumulator_wide);
    anon_unknown.dwarf_a4d1::CombinationT<unsigned_short>::CombinationT
              ((CombinationT<unsigned_short> *)auStack_57e);
    anon_unknown.dwarf_a4d1::CombinationT<bool>::CombinationT
              ((CombinationT<bool> *)((long)&__range3 + 7));
    anon_unknown.dwarf_a4d1::CombinationT<bool>::CombinationT
              ((CombinationT<bool> *)((long)&__range3 + 4));
    __end3 = std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::begin
                       ((vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_> *)&opsit)
    ;
    o = (OpInfo *)
        std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::end
                  ((vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_> *)&opsit);
    while( true ) {
      bVar12 = __gnu_cxx::operator!=
                         (&__end3,(__normal_iterator<snestistics::OpInfo_*,_std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>_>
                                   *)&o);
      uVar30 = (uint)(in_stack_ffffffffffff82e8 >> 0x20);
      uVar32 = (uint)((ulong)in_stack_ffffffffffff82f0 >> 0x20);
      uVar34 = (uint)((ulong)in_stack_ffffffffffff82f8 >> 0x20);
      if (!bVar12) break;
      _branch_target =
           __gnu_cxx::
           __normal_iterator<snestistics::OpInfo_*,_std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>_>
           ::operator*(&__end3);
      bVar12 = is_memory_accumulator_wide(_branch_target->P);
      anon_unknown.dwarf_a4d1::CombinationT<bool>::operator=
                ((CombinationT<bool> *)((long)&__range3 + 7),bVar12);
      bVar12 = is_index_wide(_branch_target->P);
      anon_unknown.dwarf_a4d1::CombinationT<bool>::operator=
                ((CombinationT<bool> *)((long)&__range3 + 4),bVar12);
      anon_unknown.dwarf_a4d1::CombinationT<unsigned_short>::operator=
                ((CombinationT<unsigned_short> *)auStack_57e,_branch_target->DP);
      anon_unknown.dwarf_a4d1::CombinationT<unsigned_char>::operator=
                ((CombinationT<unsigned_char> *)&accumulator_wide,_branch_target->DB);
      if (!bVar9) {
        _branch_target->X = 0;
      }
      if (!bVar10) {
        _branch_target->Y = 0;
      }
      if (!bVar11) {
        _branch_target->DB = '\0';
      }
      if (local_7aed == false) {
        _branch_target->DP = 0;
      }
      if (!bVar8) {
        _branch_target->indirect_base_pointer = 0;
      }
      __gnu_cxx::
      __normal_iterator<snestistics::OpInfo_*,_std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>_>
      ::operator++(&__end3);
    }
    if (op == 0x82) {
      branch_target_1._2_2_ = *(uint16_t *)(data_00 + 1);
      local_5b0 = branch16(p_00,branch_target_1._2_2_);
      pmVar22 = std::
                map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&shared_db.single_value,&local_5b0);
      std::__cxx11::string::operator=((string *)pmVar22,"");
    }
    else if ((branches[op] & 1) == 0) {
      __first = std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::begin
                          ((vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_> *)
                           &opsit);
      __last = std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::end
                         ((vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_> *)
                          &opsit);
      std::
      sort<__gnu_cxx::__normal_iterator<snestistics::OpInfo*,std::vector<snestistics::OpInfo,std::allocator<snestistics::OpInfo>>>>
                ((__normal_iterator<snestistics::OpInfo_*,_std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>_>
                  )__first._M_current,
                 (__normal_iterator<snestistics::OpInfo_*,_std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>_>
                  )__last._M_current);
      variant_idx = 0;
      for (local_5d0 = 0;
          sVar27 = std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::size
                             ((vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_> *)
                              &opsit), local_5d0 < sVar27; local_5d0 = local_5d0 + 1) {
        if (variant_idx == 0) {
LAB_00161bac:
          pvVar20 = std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::
                    operator[]((vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_> *)
                               &opsit,(ulong)local_5d0);
          pvVar21 = std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::
                    operator[]((vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_> *)
                               &opsit,(ulong)variant_idx);
          PVar2 = pvVar20->jump_target;
          pvVar21->indirect_base_pointer = pvVar20->indirect_base_pointer;
          pvVar21->jump_target = PVar2;
          uVar3 = pvVar20->DP;
          uVar4 = pvVar20->X;
          uVar5 = pvVar20->Y;
          pvVar21->P = pvVar20->P;
          pvVar21->DP = uVar3;
          pvVar21->X = uVar4;
          pvVar21->Y = uVar5;
          uVar6 = *(undefined3 *)&pvVar20->field_0x11;
          pvVar21->DB = pvVar20->DB;
          *(undefined3 *)&pvVar21->field_0x11 = uVar6;
          variant_idx = variant_idx + 1;
        }
        else {
          pvVar20 = std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::
                    operator[]((vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_> *)
                               &opsit,(ulong)local_5d0);
          pvVar21 = std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::
                    operator[]((vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_> *)
                               &opsit,(ulong)(variant_idx - 1));
          bVar12 = OpInfo::operator!=(pvVar20,pvVar21);
          if (bVar12) goto LAB_00161bac;
        }
      }
      std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::resize
                ((vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_> *)&opsit,
                 (ulong)variant_idx);
      uVar30 = (uint)(in_stack_ffffffffffff82e8 >> 0x20);
      uVar32 = (uint)((ulong)in_stack_ffffffffffff82f0 >> 0x20);
      uVar34 = (uint)((ulong)in_stack_ffffffffffff82f8 >> 0x20);
      if ((shared_db.value & 1) == 0) {
        if (!is_predicted_00) {
          vit_1._0_4_ = 0;
          while( true ) {
            uVar30 = (uint)(in_stack_ffffffffffff82e8 >> 0x20);
            uVar32 = (uint)((ulong)in_stack_ffffffffffff82f0 >> 0x20);
            uVar34 = (uint)((ulong)in_stack_ffffffffffff82f8 >> 0x20);
            uVar17 = (ulong)(uint)vit_1;
            sVar27 = std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::size
                               ((vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_> *
                                )&opsit);
            if (sVar27 <= uVar17) break;
            ranges._4092_8_ =
                 std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::operator[]
                           ((vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_> *)
                            &opsit,(ulong)(uint)vit_1);
            StringBuilder::StringBuilder((StringBuilder *)&skipped);
            if ((bVar9) || (bVar10)) {
              if (bVar9) {
                StringBuilder::add((StringBuilder *)&skipped,"X=");
              }
              if (bVar10) {
                StringBuilder::add((StringBuilder *)&skipped,"Y=");
              }
              r_1.step = 0;
              r_1.N._3_1_ = 1;
              Range::Range((Range *)((long)&vi + 4));
              if (bVar9) {
                local_7b72 = *(ushort *)(ranges._4092_8_ + 0xc);
              }
              else {
                local_7b72 = *(ushort *)(ranges._4092_8_ + 0xe);
              }
              Range::add((Range *)((long)&vi + 4),(uint)local_7b72);
              vi._0_4_ = (uint)vit_1;
              while( true ) {
                vi._0_4_ = (uint)vi + 1;
                uVar17 = (ulong)(uint)vi;
                sVar27 = std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::
                         size((vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_> *)
                              &opsit);
                if (((sVar27 <= uVar17) ||
                    (register0x00000000 =
                          std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::
                          operator[]((vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                                      *)&opsit,(ulong)(uint)vi),
                    register0x00000000->DB != *(uint8_t *)(ranges._4092_8_ + 0x10))) ||
                   (register0x00000000->DP != *(uint16_t *)(ranges._4092_8_ + 10))) break;
                if (bVar9) {
                  pvVar20 = std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::
                            operator[]((vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                                        *)&opsit,(ulong)(uint)vi);
                  local_7b82 = pvVar20->X;
                }
                else {
                  pvVar20 = std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::
                            operator[]((vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                                        *)&opsit,(ulong)(uint)vi);
                  local_7b82 = pvVar20->Y;
                }
                reg._22_4_ = ZEXT24(local_7b82);
                bVar12 = Range::fits((Range *)((long)&vi + 4),reg._22_4_);
                if (bVar12) {
                  Range::add((Range *)((long)&vi + 4),reg._22_4_);
                }
                else {
                  iVar15 = StringBuilder::length((StringBuilder *)&skipped);
                  reg.reg_X.value._1_1_ = 0x4f < iVar15;
                  if ((bool)reg.reg_X.value._1_1_) {
                    r_1.step = r_1.step + 1;
                  }
                  else {
                    if ((r_1.N._3_1_ & 1) == 0) {
                      StringBuilder::add((StringBuilder *)&skipped,", ");
                    }
                    r_1.N._3_1_ = 0;
                    Range::format((Range *)((long)&vi + 4),(StringBuilder *)&skipped);
                  }
                  Range::reset((Range *)((long)&vi + 4));
                  Range::add((Range *)((long)&vi + 4),reg._22_4_);
                }
                vit_1._0_4_ = (uint)vit_1 + 1;
              }
              if (r_1.step == 0) {
                if ((r_1.N._3_1_ & 1) == 0) {
                  StringBuilder::add((StringBuilder *)&skipped,", ");
                }
                r_1.N._3_1_ = 0;
                Range::format((Range *)((long)&vi + 4),(StringBuilder *)&skipped);
              }
              else {
                StringBuilder::format
                          ((StringBuilder *)&skipped," and %d more",(ulong)(uint)r_1.step);
              }
            }
            anon_unknown.dwarf_a4d1::CPURegisters::CPURegisters((CPURegisters *)local_263a);
            anon_unknown.dwarf_a4d1::MagicT<unsigned_short>::operator=
                      ((MagicT<unsigned_short> *)local_263a,(unsigned_short *)(ranges._4092_8_ + 8))
            ;
            anon_unknown.dwarf_a4d1::MagicT<unsigned_short>::operator=
                      ((MagicT<unsigned_short> *)&reg.pb,(unsigned_short *)(ranges._4092_8_ + 10));
            anon_unknown.dwarf_a4d1::MagicT<unsigned_char>::operator=
                      ((MagicT<unsigned_char> *)&reg.P.flags,(uchar *)(ranges._4092_8_ + 0x10));
            p._0_2_ = SUB42(p_00,0);
            rb = p._0_2_;
            anon_unknown.dwarf_a4d1::MagicT<unsigned_short>::operator=
                      ((MagicT<unsigned_short> *)(local_263a + 6),(unsigned_short *)&rb);
            p._2_1_ = (undefined1)(p_00 >> 0x10);
            ra.flags._1_1_ = p._2_1_;
            anon_unknown.dwarf_a4d1::MagicT<unsigned_char>::operator=
                      ((MagicT<unsigned_char> *)(local_263a + 4),(uchar *)((long)&ra.flags + 1));
            ra.value = 0;
            anon_unknown.dwarf_a4d1::MagicT<unsigned_short>::operator=(&reg.dp,&ra.value);
            r._2_2_ = SA_IMMEDIATE >> 0x10;
            anon_unknown.dwarf_a4d1::MagicT<unsigned_short>::operator=
                      (&reg.reg_A,(unsigned_short *)((long)&r + 2));
            anon_unknown.dwarf_a4d1::MagicT<unsigned_char>::MagicT((MagicT<unsigned_char> *)&r,'\0')
            ;
            anon_unknown.dwarf_a4d1::MagicT<unsigned_short>::MagicT
                      ((MagicT<unsigned_short> *)&p_1,0);
            anon_unknown.dwarf_a4d1::MagicT<unsigned_short>::set_unknown
                      ((MagicT<unsigned_short> *)&p_1);
            anon_unknown.dwarf_a4d1::MagicT<unsigned_char>::set_unknown((MagicT<unsigned_char> *)&r)
            ;
            bVar12 = anon_unknown.dwarf_a4d1::MagicT<unsigned_short>::isKnown
                               ((MagicT<unsigned_short> *)&p_1);
            local_7b8a = 0;
            if (!bVar12) {
              bVar12 = anon_unknown.dwarf_a4d1::MagicT<unsigned_char>::isKnown
                                 ((MagicT<unsigned_char> *)&r);
              local_7b8a = bVar12 ^ 0xff;
            }
            if ((local_7b8a & 1) == 0) {
              __assert_fail("!ra.isKnown() && !rb.isKnown()",
                            "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/asm_writer.cpp"
                            ,0x307,
                            "void snestistics::asm_writer(ReportWriter &, const Options &, Trace &, const AnnotationResolver &, const RomAccessor &)"
                           );
            }
            in_stack_ffffffffffff82f8 = 0;
            in_stack_ffffffffffff82f0 = 0;
            in_stack_ffffffffffff82e8 = 0;
            local_264c = anon_unknown.dwarf_a4d1::evaluateOp
                                   ((RomAccessor *)writer.m_report,data_00,
                                    (CPURegisters *)local_263a,(MagicByte *)&r,(MagicWord *)&p_1,
                                    (bool *)0x0,(bool *)0x0,(bool *)0x0,(bool *)0x0);
            if (((local_264c == SA_ADRESS) &&
                (bVar12 = anon_unknown.dwarf_a4d1::MagicT<unsigned_char>::isKnown
                                    ((MagicT<unsigned_char> *)&r), bVar12)) &&
               (bVar12 = anon_unknown.dwarf_a4d1::MagicT<unsigned_short>::isKnown
                                   ((MagicT<unsigned_short> *)&p_1), bVar12)) {
              local_2650 = RomAccessor::lorom_bank_remap
                                     ((RomAccessor *)writer.m_report,
                                      (uint)CONCAT12((undefined1)r,(undefined2)p_1));
              local_2658._M_node =
                   (_Base_ptr)
                   std::
                   map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::find((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&shared_db.single_value,&local_2650);
              local_2660._M_node =
                   (_Base_ptr)
                   std::
                   map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::end((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&shared_db.single_value);
              bVar12 = std::operator!=(&local_2658,&local_2660);
              if (!bVar12) {
                std::__cxx11::string::string((string *)&sb_1._length);
                local_7ba1 = 1;
                if ((!bVar11) && (local_7ba1 = 1, local_7aed == false)) {
                  bVar12 = StringBuilder::empty((StringBuilder *)&skipped);
                  local_7ba1 = bVar12 ^ 0xff;
                }
                sb_1._backing[0xfff] = local_7ba1 & 1;
                StringBuilder::StringBuilder((StringBuilder *)local_3688);
                uVar17 = std::__cxx11::string::empty();
                if (((uVar17 & 1) == 0) &&
                   (StringBuilder::add((StringBuilder *)local_3688,(string *)&sb_1._length),
                   (sb_1._backing[0xfff] & 1U) != 0)) {
                  StringBuilder::add((StringBuilder *)local_3688," ");
                }
                if ((sb_1._backing[0xfff] & 1U) != 0) {
                  StringBuilder::add((StringBuilder *)local_3688,"[");
                }
                if (bVar11) {
                  StringBuilder::format
                            ((StringBuilder *)local_3688,"DB=%X",
                             (ulong)*(byte *)(ranges._4092_8_ + 0x10));
                }
                bVar12 = !bVar11;
                if (local_7aed != false) {
                  if (!bVar12) {
                    StringBuilder::add((StringBuilder *)local_3688," ");
                  }
                  bVar12 = false;
                  StringBuilder::format
                            ((StringBuilder *)local_3688,"DP=%X",
                             (ulong)*(ushort *)(ranges._4092_8_ + 10));
                }
                bVar13 = StringBuilder::empty((StringBuilder *)&skipped);
                if (!bVar13) {
                  if (!bVar12) {
                    StringBuilder::add((StringBuilder *)local_3688," ");
                  }
                  pcVar26 = StringBuilder::c_str((StringBuilder *)&skipped);
                  StringBuilder::add((StringBuilder *)local_3688,pcVar26);
                }
                if ((sb_1._backing[0xfff] & 1U) != 0) {
                  StringBuilder::add((StringBuilder *)local_3688,"]");
                }
                pcVar26 = StringBuilder::c_str((StringBuilder *)local_3688);
                pmVar22 = std::
                          map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        *)&shared_db.single_value,&local_2650);
                std::__cxx11::string::operator=((string *)pmVar22,pcVar26);
                std::__cxx11::string::~string((string *)&sb_1._length);
              }
            }
            vit_1._0_4_ = (uint)vit_1 + 1;
          }
        }
      }
      else {
        vit._4_4_ = 0;
        while( true ) {
          sVar27 = std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::size
                             ((vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_> *)
                              &opsit);
          uVar30 = (uint)(in_stack_ffffffffffff82e8 >> 0x20);
          uVar32 = (uint)((ulong)in_stack_ffffffffffff82f0 >> 0x20);
          uVar34 = (uint)((ulong)in_stack_ffffffffffff82f8 >> 0x20);
          if (sVar27 <= vit._4_4_) break;
          sb._4092_8_ = std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::
                        operator[]((vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                                    *)&opsit,(ulong)vit._4_4_);
          if (((reference)sb._4092_8_)->jump_target != 0xffffffff) {
            StringBuilder::StringBuilder((StringBuilder *)((long)&vit_1 + 4));
            StringBuilder::clear((StringBuilder *)((long)&vit_1 + 4));
            if (bVar9) {
              StringBuilder::format
                        ((StringBuilder *)((long)&vit_1 + 4),"[X=%04X]",
                         (ulong)*(ushort *)(sb._4092_8_ + 0xc));
            }
            pcVar26 = StringBuilder::c_str((StringBuilder *)((long)&vit_1 + 4));
            pmVar22 = std::
                      map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&shared_db.single_value,(key_type *)(sb._4092_8_ + 4));
            std::__cxx11::string::operator=((string *)pmVar22,pcVar26);
          }
          vit._4_4_ = vit._4_4_ + 1;
        }
      }
    }
    else {
      local_5b4 = branch8(p_00,data_00[1]);
      pmVar22 = std::
                map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&shared_db.single_value,&local_5b4);
      std::__cxx11::string::operator=((string *)pmVar22,"");
    }
    std::__cxx11::string::string((string *)&variant_writer.is_jump);
    if (!bVar7) {
      AnnotationResolver::line_info
                (annotations,p_00,(string *)0x0,(string *)&variant_writer.is_jump,(string *)0x0,
                 false);
    }
    variant_writer.annotations = (AnnotationResolver *)&variant_writer.is_jump;
    variant_writer.line_comment._0_1_ = shared_db.value & 1;
    ss._4092_8_ = annotations;
    StringBuilder::StringBuilder((StringBuilder *)local_46cc);
    sVar23 = std::
             map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::size((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&shared_db.single_value);
    iVar15 = proposals._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
    uVar14 = (uint32_t)proposals._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if (sVar23 == 1) {
      iVar15 = strcmp((char *)&numBytesNeeded,"");
      local_46f8._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&shared_db.single_value);
      ppVar24 = std::
                _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator->(&local_46f8);
      uVar1 = ppVar24->first;
      local_4700._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&shared_db.single_value);
      ppVar24 = std::
                _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator->(&local_4700);
      asm_writer::anon_class_24_3_79b0c3fc::operator()
                ((anon_class_24_3_79b0c3fc *)local_46f0,(StringBuilder *)(ss._backing + 0xffc),
                 (Pointer)local_46cc,(Proposal *)(ulong)uVar1,(bool)((char)ppVar24 + '\b'));
      if ((iVar15 == 0) || (uVar17 = std::__cxx11::string::empty(), (uVar17 & 1) != 0)) {
        iVar15 = proposals._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
        uVar14 = (uint32_t)proposals._M_t._M_impl.super__Rb_tree_header._M_node_count;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_4720,target_label + 0x78,&local_4721);
        pcVar26 = StringBuilder::c_str((StringBuilder *)local_46cc);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_4748,pcVar26,&local_4749);
        local_475c.has_value = local_57f;
        local_475c.value = (bool)__range3._7_1_;
        local_475c.single_value = (bool)uStack_580;
        local_4760.has_value = (bool)__range3._6_1_;
        local_4760.value = (bool)__range3._4_1_;
        local_4760.single_value = (bool)__range3._5_1_;
        wow[0xfe] = accumulator_wide.has_value;
        wow[0xfc] = accumulator_wide.value;
        wow[0xfd] = accumulator_wide.single_value;
        in_stack_ffffffffffff82f8 = (ulong)uVar34 << 0x20;
        in_stack_ffffffffffff82f0 = (ulong)uVar32 << 0x20;
        in_stack_ffffffffffff82e8 = (ulong)uVar30 << 0x20;
        anon_unknown.dwarf_a4d1::AsmWriteWLADX::writeInstruction
                  ((AsmWriteWLADX *)local_68,p_00,iVar15,uVar14,(string *)local_4720,
                   (string *)local_4748,local_475c,local_4760,(Combination8)wow._252_3_,_auStack_57e
                   ,is_predicted_00);
        std::__cxx11::string::~string(local_4748);
        std::allocator<char>::~allocator((allocator<char> *)&local_4749);
        std::__cxx11::string::~string(local_4720);
        std::allocator<char>::~allocator((allocator<char> *)&local_4721);
      }
      else {
        uVar25 = std::__cxx11::string::c_str();
        sprintf(local_4868,(char *)&numBytesNeeded,uVar25);
        iVar15 = proposals._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
        uVar14 = (uint32_t)proposals._M_t._M_impl.super__Rb_tree_header._M_node_count;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_4888,local_4868,&local_4889);
        pcVar26 = StringBuilder::c_str((StringBuilder *)local_46cc);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_48b0,pcVar26,&local_48b1);
        local_48b2 = local_57f;
        local_48b4 = stack0xfffffffffffffa7f;
        local_48b6 = __range3._6_1_;
        local_48b8 = __range3._4_2_;
        local_48bc.has_value = accumulator_wide.has_value;
        local_48bc.value = accumulator_wide.value;
        local_48bc.single_value = accumulator_wide.single_value;
        local_48c0 = _auStack_57e;
        local_48c4.has_value = local_57f;
        local_48c4.value = (bool)__range3._7_1_;
        local_48c4.single_value = (bool)uStack_580;
        local_48c8.has_value = (bool)__range3._6_1_;
        local_48c8.value = (bool)__range3._4_1_;
        local_48c8.single_value = (bool)__range3._5_1_;
        local_48cc.has_value = accumulator_wide.has_value;
        local_48cc.value = accumulator_wide.value;
        local_48cc.single_value = accumulator_wide.single_value;
        in_stack_ffffffffffff82f8 = (ulong)uVar34 << 0x20;
        in_stack_ffffffffffff82f0 = (ulong)uVar32 << 0x20;
        in_stack_ffffffffffff82e8 = (ulong)uVar30 << 0x20;
        anon_unknown.dwarf_a4d1::AsmWriteWLADX::writeInstruction
                  ((AsmWriteWLADX *)local_68,p_00,iVar15,uVar14,(string *)local_4888,
                   (string *)local_48b0,local_48c4,local_48c8,(Combination8)local_48cc,_auStack_57e,
                   is_predicted_00);
        std::__cxx11::string::~string(local_48b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_48b1);
        std::__cxx11::string::~string(local_4888);
        std::allocator<char>::~allocator((allocator<char> *)&local_4889);
      }
      std::__cxx11::string::~string((string *)local_46f0);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_48f0,target_label + 0x78,&local_48f1);
      local_4904.has_value = local_57f;
      local_4904.value = (bool)__range3._7_1_;
      local_4904.single_value = (bool)uStack_580;
      local_4908.has_value = (bool)__range3._6_1_;
      local_4908.value = (bool)__range3._4_1_;
      local_4908.single_value = (bool)__range3._5_1_;
      pit._M_node._6_1_ = accumulator_wide.has_value;
      pit._M_node._4_1_ = accumulator_wide.value;
      pit._M_node._5_1_ = accumulator_wide.single_value;
      in_stack_ffffffffffff82f8 = (ulong)uVar34 << 0x20;
      in_stack_ffffffffffff82f0 = (ulong)uVar32 << 0x20;
      in_stack_ffffffffffff82e8 = (ulong)uVar30 << 0x20;
      anon_unknown.dwarf_a4d1::AsmWriteWLADX::writeInstruction
                ((AsmWriteWLADX *)local_68,p_00,iVar15,uVar14,(string *)local_48f0,
                 (string *)&variant_writer.is_jump,local_4904,local_4908,pit._M_node._4_3_,
                 _auStack_57e,is_predicted_00);
      std::__cxx11::string::~string(local_48f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_48f1);
      local_4918._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&shared_db.single_value);
      while( true ) {
        local_4920._M_node =
             (_Base_ptr)
             std::
             map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&shared_db.single_value);
        bVar7 = std::operator!=(&local_4918,&local_4920);
        if (!bVar7) break;
        ppVar24 = std::
                  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator->(&local_4918);
        uVar30 = ppVar24->first;
        ppVar24 = std::
                  _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator->(&local_4918);
        asm_writer::anon_class_24_3_79b0c3fc::operator()
                  ((anon_class_24_3_79b0c3fc *)local_4940,(StringBuilder *)(ss._backing + 0xffc),
                   (Pointer)local_46cc,(Proposal *)(ulong)uVar30,(bool)((char)ppVar24 + '\b'));
        pcVar26 = StringBuilder::c_str((StringBuilder *)local_46cc);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&variant_idx_2,pcVar26,(allocator *)((long)&v_1 + 7))
        ;
        anon_unknown.dwarf_a4d1::AsmWriteWLADX::writeComment
                  ((AsmWriteWLADX *)local_68,p_00,(string *)&variant_idx_2,0,10);
        std::__cxx11::string::~string((string *)&variant_idx_2);
        std::allocator<char>::~allocator((allocator<char> *)((long)&v_1 + 7));
        std::__cxx11::string::~string((string *)local_4940);
        std::
        _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator++(&local_4918);
      }
    }
    if (((bVar8) && ((shared_db.value & 1) == 0)) && (!is_predicted_00)) {
      for (v_1._0_4_ = 0; uVar17 = (ulong)(uint)v_1,
          sVar27 = std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::size
                             ((vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_> *)
                              &opsit), uVar17 < sVar27; v_1._0_4_ = (uint)v_1 + 1) {
        pvVar20 = std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::operator[]
                            ((vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_> *)
                             &opsit,(ulong)(uint)v_1);
        StringBuilder::StringBuilder((StringBuilder *)&r_2.N);
        if ((bVar9) || (bVar10)) {
          if (bVar9) {
            StringBuilder::add((StringBuilder *)&r_2.N," X=");
          }
          if (bVar10) {
            StringBuilder::add((StringBuilder *)&r_2.N," Y=");
          }
          Range::Range((Range *)&skipped_1);
          bVar7 = true;
          local_5988 = 0;
          if (bVar9) {
            local_7c6a = pvVar20->X;
          }
          else {
            local_7c6a = pvVar20->Y;
          }
          Range::add((Range *)&skipped_1,(uint)local_7c6a);
          v2._4_4_ = (uint)v_1;
          while( true ) {
            v2._4_4_ = v2._4_4_ + 1;
            sVar27 = std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::size
                               ((vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_> *
                                )&opsit);
            if (((sVar27 <= v2._4_4_) ||
                (register0x00000000 =
                      std::vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>::
                      operator[]((vector<snestistics::OpInfo,_std::allocator<snestistics::OpInfo>_>
                                  *)&opsit,(ulong)v2._4_4_), pvVar20->DB != register0x00000000->DB))
               || ((pvVar20->DP != register0x00000000->DP ||
                   (pvVar20->indirect_base_pointer != register0x00000000->indirect_base_pointer))))
            break;
            if (bVar9) {
              local_7c7a = register0x00000000->X;
            }
            else {
              local_7c7a = register0x00000000->Y;
            }
            ss_1._backing._4092_4_ = ZEXT24(local_7c7a);
            bVar8 = Range::fits((Range *)&skipped_1,ss_1._backing._4092_4_);
            if (bVar8) {
              Range::add((Range *)&skipped_1,ss_1._backing._4092_4_);
            }
            else {
              iVar15 = StringBuilder::length((StringBuilder *)&r_2.N);
              if (iVar15 < 0x81) {
                if (!bVar7) {
                  StringBuilder::add((StringBuilder *)&r_2.N,", ");
                }
                bVar7 = false;
                Range::format((Range *)&skipped_1,(StringBuilder *)&r_2.N);
              }
              else {
                local_5988 = local_5988 + 1;
              }
              Range::reset((Range *)&skipped_1);
            }
            v_1._0_4_ = (uint)v_1 + 1;
          }
          if ((local_5988 == 0) && (iStack_597c != 0)) {
            if (!bVar7) {
              StringBuilder::add((StringBuilder *)&r_2.N,", ");
            }
            Range::format((Range *)&skipped_1,(StringBuilder *)&r_2.N);
          }
          else if (local_5988 != 0) {
            StringBuilder::format((StringBuilder *)&r_2.N," (and %d more)",(ulong)local_5988);
          }
        }
        StringBuilder::StringBuilder((StringBuilder *)local_69a0);
        std::__cxx11::string::string(local_69c0);
        AnnotationResolver::label
                  ((AnnotationResolver *)local_69e0,(Pointer)annotations,
                   (string *)(ulong)pvVar20->indirect_base_pointer,SUB81(local_69c0,0));
        StringBuilder::format
                  ((StringBuilder *)local_69a0,"indirect base=%06X",
                   (ulong)pvVar20->indirect_base_pointer);
        if (local_7aed != false) {
          StringBuilder::format((StringBuilder *)local_69a0,", DP=%X",(ulong)pvVar20->DP);
        }
        if (bVar11) {
          StringBuilder::format((StringBuilder *)local_69a0,", DB=%X",(ulong)pvVar20->DB);
        }
        bVar7 = StringBuilder::empty((StringBuilder *)&r_2.N);
        if (!bVar7) {
          pcVar26 = StringBuilder::c_str((StringBuilder *)&r_2.N);
          StringBuilder::add((StringBuilder *)local_69a0,pcVar26);
        }
        uVar17 = std::__cxx11::string::empty();
        if ((uVar17 & 1) == 0) {
          StringBuilder::add<char[4],std::__cxx11::string>
                    ((StringBuilder *)local_69a0,(char (*) [4])" - ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_69e0
                    );
        }
        uVar17 = std::__cxx11::string::empty();
        if ((uVar17 & 1) == 0) {
          StringBuilder::add<char[4],std::__cxx11::string>
                    ((StringBuilder *)local_69a0,(char (*) [4])" - ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_69c0
                    );
        }
        pcVar26 = StringBuilder::c_str((StringBuilder *)local_69a0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_6a00,pcVar26,(allocator *)((long)&d + 7));
        anon_unknown.dwarf_a4d1::AsmWriteWLADX::writeComment
                  ((AsmWriteWLADX *)local_68,p_00,(string *)local_6a00,0,10);
        std::__cxx11::string::~string(local_6a00);
        std::allocator<char>::~allocator((allocator<char> *)((long)&d + 7));
        std::__cxx11::string::~string((string *)local_69e0);
        std::__cxx11::string::~string(local_69c0);
      }
    }
    while( true ) {
      sVar27 = std::vector<snestistics::DmaTransfer,_std::allocator<snestistics::DmaTransfer>_>::
               size(&trace->dma_transfers);
      bVar7 = false;
      if ((ulong)(long)__range1._4_4_ < sVar27) {
        pvVar28 = std::vector<snestistics::DmaTransfer,_std::allocator<snestistics::DmaTransfer>_>::
                  operator[](&trace->dma_transfers,(long)__range1._4_4_);
        bVar7 = pvVar28->pc == p_00;
      }
      uVar31 = (undefined4)(in_stack_ffffffffffff82e8 >> 0x20);
      uVar33 = (undefined4)((ulong)in_stack_ffffffffffff82f0 >> 0x20);
      uVar35 = (undefined4)((ulong)in_stack_ffffffffffff82f8 >> 0x20);
      if (!bVar7) break;
      ss_2._4092_8_ =
           std::vector<snestistics::DmaTransfer,_std::allocator<snestistics::DmaTransfer>_>::
           operator[](&trace->dma_transfers,(long)__range1._4_4_);
      StringBuilder::StringBuilder((StringBuilder *)&num_bytes);
      local_7a15 = (*(byte *)(ss_2._4092_8_ + 0x10) & 1) != 0;
      if (*(short *)(ss_2._4092_8_ + 6) == 0) {
        local_7cc4 = 0x10000;
      }
      else {
        local_7cc4 = (uint)*(ushort *)(ss_2._4092_8_ + 6);
      }
      local_7a1c = local_7cc4;
      if (*(char *)(ss_2._4092_8_ + 9) != -0x80) {
        __assert_fail("d.b_address == 0x80",
                      "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/asm_writer.cpp"
                      ,0x3c0,
                      "void snestistics::asm_writer(ReportWriter &, const Options &, Trace &, const AnnotationResolver &, const RomAccessor &)"
                     );
      }
      if ((bool)local_7a15) {
        local_7cd8 = "<-";
      }
      else {
        local_7cd8 = "->";
      }
      pcVar29 = "";
      pcVar26 = "";
      if ((*(byte *)(ss_2._4092_8_ + 0x10) & 4) != 0) {
        pcVar26 = " (decrease A)";
      }
      if ((*(byte *)(ss_2._4092_8_ + 0x10) & 2) != 0) {
        pcVar29 = " (A fixed)";
      }
      in_stack_ffffffffffff82f8 = CONCAT44(uVar35,local_7cc4);
      in_stack_ffffffffffff82f0 = CONCAT44(uVar33,local_7cc4);
      in_stack_ffffffffffff82e8 =
           CONCAT44(uVar31,*(uint *)(ss_2._4092_8_ + 0xc)) & 0xffffffff0000ffff;
      StringBuilder::format
                ((StringBuilder *)&num_bytes,
                 "dma-event $%02X:%04X %s $%02X:%04X (via $2180), $%X/%d bytes%s%s",
                 (ulong)*(byte *)(ss_2._4092_8_ + 10),(ulong)*(ushort *)(ss_2._4092_8_ + 4),
                 local_7cd8,(ulong)(*(uint *)(ss_2._4092_8_ + 0xc) >> 0x10),
                 in_stack_ffffffffffff82e8,in_stack_ffffffffffff82f0,in_stack_ffffffffffff82f8,
                 pcVar26,pcVar29);
      pcVar26 = StringBuilder::c_str((StringBuilder *)&num_bytes);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7a40,pcVar26,&local_7a41);
      anon_unknown.dwarf_a4d1::AsmWriteWLADX::writeComment
                ((AsmWriteWLADX *)local_68,p_00,(string *)local_7a40,0,10);
      std::__cxx11::string::~string(local_7a40);
      std::allocator<char>::~allocator((allocator<char> *)&local_7a41);
      __range1._4_4_ = __range1._4_4_ + 1;
    }
    std::__cxx11::string::~string((string *)&variant_writer.is_jump);
    std::
    map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&shared_db.single_value);
    std::_Rb_tree_iterator<std::pair<const_unsigned_int,_snestistics::Trace::OpVariantLookup>_>::
    operator++(&local_320);
  } while( true );
}

Assistant:

void asm_writer(ReportWriter &report, const Options &options, Trace &trace, const AnnotationResolver &annotations, const RomAccessor &rom_accessor) {
	AsmWriteWLADX writer(report, options, rom_accessor);

	int next_dma_event = 0;

	for (const Annotation &a : annotations._annotations) {
		if (a.type == ANNOTATION_FUNCTION || (a.type == ANNOTATION_LINE && !a.name.empty()))
			trace.labels.set_bit(a.startOfRange);
	}

	writer.writeSeperator("Header");

	if (!options.asm_header_file.empty()) {
		Array<unsigned char> header;
		read_file(options.asm_header_file, header);
		fwrite(&header[0], header.size(), 1, report.report);
		char newline = '\n';
		fwrite(&newline, 1, 1, report.report);
	}

	writer.write_vectors(annotations, trace.labels);

	writer.writeSeperator("Data");

	// Generate EQU for each label
	// TODO: Only include USED labels?
	for (const Annotation &a : annotations._annotations) {
		if (a.type != ANNOTATION_DATA)
			continue;

		// NOTE: We only use 16-bit here... the high byte is almost never used in an op
		// TODO: Validate so this doesn't mess thing up when we use it
		char target[512];
		sprintf(target, "$%04X", a.startOfRange&0xFFFF);
		writer.writeDefine(a.name, target, a.comment.empty() ? a.useComment : a.comment);
	}

	writer.writeSeperator("Code");

	Pointer nextOp(INVALID_POINTER);

	std::vector<OpInfo> variants;
	variants.reserve(1024*64);

	// Now iterate the ops
	for (auto opsit = trace.ops.begin(); opsit != trace.ops.end(); ++opsit) {
		const Pointer pc = opsit->first;

		if (nextOp == INVALID_POINTER) {
			nextOp = pc;
		}

		bool emitted_label = false;

		// TODO: Emit any labels that we might have skipped as well as label for current line
		//       This is mostly if the static jump predictor is predicting a jump into non-ops.
		for (Pointer p(nextOp); p <= pc; ++p) {
			if (trace.labels[p]) {
				// Emit label?
				std::string label, line_comment, line_use_comment;

				annotations.line_info(p, &label, &line_comment, &line_use_comment, true);

				std::string description = line_comment;
				if (line_comment.empty()) {
					description = line_use_comment;
				}

				bool shortmode = false;//!multiline && description.size() < 20;

				writer.writeLabel(p, label, shortmode ? "" : description, shortmode ? description : "");

				if (p == pc)
					emitted_label = true;
			}
		}

		const Trace::OpVariantLookup variant_lookup = opsit->second;
		assert(variant_lookup.count != 0);

		const uint8_t *data = rom_accessor.evalPtr(pc);
		const uint8_t opcode = *data;

		// Determine number of bytes needed for this instruction
		// Here I've assumed that either these flags agree for ALL variants, or that they are irrelevant for this opcode
		const OpInfo &first_variant = trace.variant(variant_lookup, 0);
		const bool acc16 = is_memory_accumulator_wide(first_variant.P);
		const bool ind16 = is_index_wide(first_variant.P);
		const bool emu   = is_emulation_mode(first_variant.P);
		const bool is_predicted = trace.is_predicted[pc];
		if (emu) printf("emu mode at pc %06X\n", pc);

		char target[128] = "\0";
		char target_label[128] = "\0";
		int numBitsNeeded = 8;

		const uint32_t numBytesNeeded = calculateFormattingandSize(data, acc16, ind16, target, target_label, &numBitsNeeded);

		nextOp = pc + numBytesNeeded;

		typedef std::string Proposal;
		typedef std::map<Pointer, Proposal> Proposals;
		Proposals proposals; // Given destionation/source give comment on how we got there

		const bool is_jump = jumps[opcode]; // TODO: Cover all jumps we want? And not too many?

		// Does adress depend on ....?
		bool is_indirect = cputable::is_indirect(opcode);
		const bool depend_X = cputable::address_depend_x(opcode);
		const bool depend_Y = cputable::address_depend_y(opcode);
		const bool depend_DB = cputable::address_depend_db(opcode);
		const bool depend_DP = is_jump ? false : cputable::address_depend_dp(opcode);

		// First copy all variants into our local vector where we can modify
		variants.resize(variant_lookup.count);
		memcpy(&variants[0], &trace.ops_variants[variant_lookup.offset], variant_lookup.count * sizeof(OpInfo));

		// These know if they have been assigned no value, one value (maybe multiple times) or multiple different values
		Combination8 shared_db;
		Combination16 shared_dp;
		CombinationBool accumulator_wide;
		CombinationBool index_wide;

		{
			// NOTE-TODO: While an op might depend on say DB it might not use it if adress is in $0000-$1999

			// Zero out unused registers so our sort get items in correct order
			for (OpInfo &o : variants) {
				accumulator_wide = is_memory_accumulator_wide(o.P);
				index_wide = is_index_wide(o.P);
				shared_dp = o.DP;
				shared_db = o.DB;
				if (!depend_X) o.X = 0;
				if (!depend_Y) o.Y = 0;
				if (!depend_DB) o.DB = 0;
				if (!depend_DP) o.DP = 0;
				if (!is_indirect) o.indirect_base_pointer = 0;
			}
		}

		if (opcode == 0x82) {
			// BRL
			uint16_t operand16 = data[1]|(data[2]<<8);
			const Pointer branch_target = branch16(pc, operand16);
			proposals[branch_target] = "";
		} else if (branches[opcode]) {
			const Pointer branch_target = branch8(pc, data[1]);
			proposals[branch_target] = "";
		} else {
			// Sort and make variants unique
			std::sort(variants.begin(), variants.end());

			uint32_t num_unique_variants = 0;

			// Remove duplicates
			for (uint32_t source_idx = 0; source_idx < variants.size(); source_idx++) {
				if (num_unique_variants == 0 || variants[source_idx] != variants[num_unique_variants - 1]) {
					variants[num_unique_variants++] = variants[source_idx];
				}
			}
			variants.resize(num_unique_variants);

			if (is_jump) {
				for (uint32_t variant_idx = 0; variant_idx < variants.size(); ++variant_idx) {
					const OpInfo &vit = variants[variant_idx];
					if (vit.jump_target == INVALID_POINTER)
						continue;
					StringBuilder sb;
					sb.clear();
					if (depend_X)
						sb.format("[X=%04X]", vit.X);
					proposals[vit.jump_target] = sb.c_str();
				}

			} else if (!is_predicted) {

				for (uint32_t variant_idx = 0; variant_idx < variants.size(); ++variant_idx) {

					const OpInfo &vit = variants[variant_idx];

					StringBuilder ranges;
					if (depend_X||depend_Y) {
						if (depend_X) ranges.add("X=");
						if (depend_Y) ranges.add("Y=");

						int max_size = 80;
						int skipped = 0;

						bool first = true;

						Range r;
						r.add(depend_X?vit.X:vit.Y);
						for (uint32_t v = variant_idx+1; v < variants.size(); ++v) {
							const OpInfo &vi = variants[v];
							if (vi.DB != vit.DB || vi.DP != vit.DP)
								break;
							int value = depend_X ? variants[v].X : variants[v].Y;
							if (r.fits(value)) {
								r.add(value);
							} else {
								bool skip = ranges.length() >= max_size;
								if (!skip) {
									if (!first) ranges.add(", "); first = false;
									r.format(ranges);
								} else {
									skipped++;
								}
								r.reset();
								r.add(value);
							}
							variant_idx++;
						}
						if (skipped == 0) {
							if (!first) ranges.add(", "); first = false;
							r.format(ranges);
						} else {
							ranges.format(" and %d more", skipped);
						}
					}

					CPURegisters reg;
					reg.P = vit.P;
					reg.dp = vit.DP;
					reg.db = vit.DB;
					reg.pc = pc & 0xFFFF;
					reg.pb = pc >> 16;
					reg.reg_X = 0; // Start at 0 to get base pointer
					reg.reg_Y = 0; // Start at 0 to get base pointer
					MagicByte rb(0);
					MagicWord ra(0);
					ra.set_unknown();
					rb.set_unknown();
					assert(!ra.isKnown() && !rb.isKnown());
					const ResultType r = evaluateOp(rom_accessor, data, reg, &rb, &ra, nullptr, nullptr, nullptr, nullptr);

					if (r == SA_ADRESS && rb.isKnown() && ra.isKnown()) {
						const Pointer p = rom_accessor.lorom_bank_remap((rb.value << 16) | ra.value);

						//if((p>>16)!=rb.value) // data bank was removed due to adressing being shuffled into 7E
						// depend_DB = false;

						if (proposals.find(p) != proposals.end())
							continue;

						std::string use_comment;

						bool has_remark = depend_DB || depend_DP || !ranges.empty();

						StringBuilder sb;
						if (!use_comment.empty()) {
							sb.add(use_comment);
							if (has_remark)
								sb.add(" ");
						}
						bool first = true;
						if (has_remark)
							sb.add("[");
						if (depend_DB) {
							if (!first) sb.add(" "); first = false;
							sb.format("DB=%X", vit.DB);
						}
						if (depend_DP) {
							if (!first) sb.add(" "); first = false;
							sb.format("DP=%X", vit.DP);
						}
						if (!ranges.empty()) {
							if (!first) sb.add(" "); first = false;
							sb.add(ranges.c_str());
						}
						if (has_remark)
							sb.add("]");

						proposals[p] = sb.c_str();
					}
				}
			}
		}

		std::string line_comment;
		if (!emitted_label) {
			annotations.line_info(pc, nullptr, &line_comment, nullptr, false);
		}

		auto variant_writer = [&annotations, &line_comment, is_jump](StringBuilder &ss, const Pointer target_pointer, const Proposal &p, bool name_in_code) {
			ss.clear();
			std::string use_comment, pointer_comment = p;
			const std::string name = annotations.label(target_pointer, &use_comment, is_jump);

			if (!name_in_code || name.empty()) {
				if (!name.empty()) {
					ss.format("%s ", name.c_str()); // Name
				} else {
					ss.format("%06X ", target_pointer);
				}
			}

			bool first = true;
			if (!line_comment.empty()) {
				if (!first) ss.add(" - "); first = false;
				ss.add(line_comment);
			}
			if (!use_comment.empty()) {
				if (!first) ss.add(" - "); first = false;
				ss.add(use_comment);
			}
			if (!pointer_comment.empty()) {
				if (!first) ss.add(" - "); first = false;
				ss.add(pointer_comment);
			}
			return name;
		};

		StringBuilder ss;

		if (proposals.size() == 1) {

			// All variant agree that this is the only choice
			// If we have a valid label we might be able to use that in the op-code
			// It might not be possible to codify it though since it might generate the wrong opcode
			// If target_label is non-empty we can codify using a label

			const bool name_in_code = strcmp(target_label, "") != 0;
			std::string name = variant_writer(ss, proposals.begin()->first, proposals.begin()->second, name_in_code);

			if (!name_in_code || name.empty()) {
				writer.writeInstruction(pc, numBitsNeeded, numBytesNeeded, target, ss.c_str(), accumulator_wide, index_wide, shared_db, shared_dp, is_predicted);
			} else {
				char wow[256];
				sprintf(wow, target_label, name.c_str());
				writer.writeInstruction(pc, numBitsNeeded, numBytesNeeded, wow, ss.c_str(), accumulator_wide, index_wide, shared_db, shared_dp, is_predicted);
			}
		} else {
			writer.writeInstruction(pc, numBitsNeeded, numBytesNeeded, target, line_comment, accumulator_wide, index_wide, shared_db, shared_dp, is_predicted);
			// List all possible targets in comments!
			for (auto pit = proposals.begin(); pit != proposals.end(); ++pit) {
				std::string name = variant_writer(ss, pit->first, pit->second, false);
				writer.writeComment(pc, ss.c_str(), 0, 10);
			}
		}

		if (is_indirect && !is_jump && !is_predicted) {
			for (uint32_t variant_idx = 0; variant_idx < variants.size(); ++variant_idx) {

				const OpInfo &v = variants[variant_idx];

				StringBuilder ranges;
					
				if (depend_X||depend_Y) {
					if (depend_X) ranges.add(" X=");
					if (depend_Y) ranges.add(" Y=");
					Range r;
					bool first = true;
					int skipped = 0;

					r.add(depend_X ? v.X : v.Y);

					for (uint32_t vi2 = variant_idx+1; vi2 < variants.size(); ++vi2) {
						const OpInfo &v2 = variants[vi2];
						if (v.DB != v2.DB) break;
						if (v.DP != v2.DP) break;
						if (v.indirect_base_pointer != v2.indirect_base_pointer) break;

						int value = depend_X ? v2.X : v2.Y;

						if (r.fits(value)) {
							r.add(value);
								
						} else {
							if (ranges.length() > 128) {
								skipped++;
							} else {
								if (!first)	ranges.add(", "); first = false;
								r.format(ranges);
							}
							r.reset();
						}

						variant_idx++;
					}
					if (skipped==0 && r.N != 0) {
						if (!first)	ranges.add(", "); first = false;
						r.format(ranges);
					} else if (skipped !=0) {
						ranges.format(" (and %d more)", skipped);
					}
				}

				StringBuilder ss;

				std::string use_comment;
				const std::string name = annotations.label(v.indirect_base_pointer, &use_comment, is_jump);

				ss.format("indirect base=%06X", v.indirect_base_pointer);
				if (depend_DP) ss.format(", DP=%X", v.DP);
				if (depend_DB) ss.format(", DB=%X", v.DB);

				if (!ranges.empty()) {
					ss.add(ranges.c_str());
				}

				if (!name.empty()) {
					ss.add(" - ", name);
				}

				if (!use_comment.empty()) {
					ss.add(" - ", use_comment);
				}

				writer.writeComment(pc, ss.c_str(), 0, 10);
			}
		}

		while (next_dma_event < trace.dma_transfers.size() && trace.dma_transfers[next_dma_event].pc == pc) {
			const DmaTransfer &d = trace.dma_transfers[next_dma_event++];
			StringBuilder ss;
			bool reverse = d.flags & DmaTransfer::REVERSE_TRANSFER;
			int num_bytes = d.transfer_bytes == 0 ? 0x10000 : d.transfer_bytes;
			assert(d.b_address == 0x80); // So we can detect that we've enabled more and can improve
			ss.format("dma-event $%02X:%04X %s $%02X:%04X (via $2180), $%X/%d bytes%s%s", d.a_bank, d.a_address, reverse ? "<-" : "->", d.wram>>16, d.wram&0xFFFF, num_bytes, num_bytes, d.flags & DmaTransfer::A_ADDRESS_DECREMENT ?" (decrease A)":"", d.flags & DmaTransfer::A_ADDRESS_FIXED ? " (A fixed)":"");
			writer.writeComment(pc, ss.c_str(), 0, 10);
		}
	}
}